

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * __thiscall CLI::App::get_usage_abi_cxx11_(string *__return_storage_ptr__,App *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((this->usage_callback_).super__Function_base._M_manager == (_Manager_type)0x0) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,&this->usage_);
  }
  else {
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator()(&local_38,&this->usage_callback_);
    ::std::operator+(&bStack_58,&local_38,'\n');
    ::std::operator+(__return_storage_ptr__,&bStack_58,&this->usage_);
    ::std::__cxx11::string::~string((string *)&bStack_58);
    ::std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_NODISCARD std::string get_usage() const {
        return (usage_callback_) ? usage_callback_() + '\n' + usage_ : usage_;
    }